

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindTerminals
          (SeparatedSyntaxList<slang::syntax::NameSyntax> *syntaxList,SpecifyTerminalDir dir,
          Scope *parentParent,ASTContext *context)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  undefined4 extraout_var;
  Scope *extraout_RDX;
  Scope *extraout_RDX_00;
  Scope *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  ulong uVar2;
  long lVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar4;
  Expression *expr;
  SmallVector<const_slang::ast::Expression_*,_5UL> results;
  Expression *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  uVar2 = (syntaxList->elements)._M_extent._M_extent_value + 1;
  src = parentParent;
  if (1 < uVar2) {
    uVar2 = uVar2 >> 1;
    lVar3 = 0;
    do {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntaxList->elements)._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar3));
      local_78 = bindTerminal((ExpressionSyntax *)*ppSVar1,dir,parentParent,context);
      src = extraout_RDX;
      if (local_78 != (Expression *)0x0) {
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
        src = extraout_RDX_00;
      }
      lVar3 = lVar3 + 0x30;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  sVar4._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_70,(EVP_PKEY_CTX *)((context->scope).ptr)->compilation,(EVP_PKEY_CTX *)src);
  sVar4._M_ptr._4_4_ = extraout_var;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  sVar4._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  return sVar4;
}

Assistant:

static std::span<const Expression* const> bindTerminals(
    const SeparatedSyntaxList<NameSyntax>& syntaxList, SpecifyBlockSymbol::SpecifyTerminalDir dir,
    const Scope* parentParent, ASTContext& context) {

    SmallVector<const Expression*> results;
    for (auto exprSyntax : syntaxList) {
        auto expr = bindTerminal(*exprSyntax, dir, parentParent, context);
        if (expr)
            results.push_back(expr);
    }
    return results.copy(context.getCompilation());
}